

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O3

Vec_Wec_t * Gia_ManComputeMffcs(Gia_Man_t *p,int LimitMin,int LimitMax,int SuppMax,int RatioBest)

{
  Gia_Obj_t *pObj;
  int Entry;
  uint uVar1;
  Gia_Obj_t *pGVar2;
  int *piVar3;
  int iVar4;
  int iVar5;
  Vec_Int_t *vNodes;
  int *piVar6;
  Vec_Int_t *__ptr;
  Vec_Int_t *p_00;
  Vec_Wec_t *pVVar7;
  long lVar8;
  uint uVar9;
  Vec_Int_t *pVVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  int **ppiVar14;
  Vec_Int_t *local_80;
  ulong local_68;
  
  if (p->pMuxes == (uint *)0x0) {
    __assert_fail("p->pMuxes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaResub.c"
                  ,0x67,"Vec_Wec_t *Gia_ManComputeMffcs(Gia_Man_t *, int, int, int, int)");
  }
  vNodes = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < LimitMax * 2 - 1U) {
    iVar4 = LimitMax * 2;
  }
  vNodes->nSize = 0;
  vNodes->nCap = iVar4;
  lVar8 = (long)iVar4;
  if (iVar4 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc(lVar8 * 4);
  }
  vNodes->pArray = piVar6;
  __ptr = (Vec_Int_t *)malloc(0x10);
  __ptr->nSize = 0;
  __ptr->nCap = iVar4;
  if (iVar4 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc(lVar8 * 4);
  }
  __ptr->pArray = piVar6;
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nSize = 0;
  p_00->nCap = iVar4;
  if (iVar4 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc(lVar8 << 2);
  }
  p_00->pArray = piVar6;
  pVVar7 = (Vec_Wec_t *)malloc(0x10);
  pVVar7->nCap = 1000;
  pVVar7->nSize = 0;
  local_80 = (Vec_Int_t *)calloc(1000,0x10);
  pVVar7->pArray = local_80;
  Gia_ManCreateRefs(p);
  if (p->nObjs < 1) {
    uVar11 = 0;
  }
  else {
    local_68 = 1000;
    uVar11 = 0;
    lVar8 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pObj = p->pObjs + lVar8;
      if (((~*(uint *)pObj & 0x1fffffff) != 0 && -1 < (int)*(uint *)pObj) && (p->pRefs[lVar8] != 0))
      {
        vNodes->nSize = 0;
        iVar4 = Gia_ObjCheckMffc_rec(p,pObj,LimitMax,vNodes);
        if (iVar4 != 0) {
          __ptr->nSize = 0;
          p_00->nSize = 0;
          qsort(vNodes->pArray,(long)vNodes->nSize,4,Vec_IntSortCompare1);
          iVar5 = vNodes->nSize;
          if (0 < iVar5) {
            lVar12 = 0;
            do {
              Entry = vNodes->pArray[lVar12];
              if (p->pRefs[Entry] < 1) {
                if ((Entry < 0) || (p->nObjs <= Entry)) {
                  __assert_fail("v >= 0 && v < p->nObjs",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                                ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
                }
                if ((~*(uint *)(p->pObjs + Entry) & 0x9fffffff) == 0) goto LAB_0070f3ff;
                uVar13 = (ulong)(uint)p_00->nSize;
                pVVar10 = p_00;
                if (uVar13 != 0) {
                  if (p_00->nSize < 1) goto LAB_0070f80a;
                  piVar6 = p_00->pArray;
                  goto LAB_0070f41a;
                }
LAB_0070f420:
                Vec_IntPush(pVVar10,Entry);
                iVar5 = vNodes->nSize;
              }
              else {
LAB_0070f3ff:
                uVar13 = (ulong)(uint)__ptr->nSize;
                pVVar10 = __ptr;
                if (uVar13 == 0) goto LAB_0070f420;
                if (__ptr->nSize < 1) {
LAB_0070f80a:
                  __assert_fail("p->nSize > 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                                ,0x1f8,"int Vec_IntEntryLast(Vec_Int_t *)");
                }
                piVar6 = __ptr->pArray;
LAB_0070f41a:
                if (piVar6[uVar13 - 1] != Entry) goto LAB_0070f420;
              }
              lVar12 = lVar12 + 1;
            } while (lVar12 < iVar5);
          }
          pGVar2 = p->pObjs;
          if ((pObj < pGVar2) || (pGVar2 + p->nObjs <= pObj)) {
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                          ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          Vec_IntPush(p_00,(int)((ulong)((long)pObj - (long)pGVar2) >> 2) * -0x55555555);
        }
        if (0 < vNodes->nSize) {
          piVar6 = vNodes->pArray;
          piVar3 = p->pRefs;
          lVar12 = 0;
          do {
            piVar3[piVar6[lVar12]] = piVar3[piVar6[lVar12]] + 1;
            lVar12 = lVar12 + 1;
          } while (lVar12 < vNodes->nSize);
        }
        if ((iVar4 != 0) && (iVar4 = p_00->nSize, LimitMin <= iVar4)) {
          uVar1 = __ptr->nSize;
          if ((int)uVar1 <= SuppMax) {
            uVar9 = (uint)local_68;
            if (uVar11 == uVar9) {
              if ((int)uVar9 < 0x10) {
                if (local_80 == (Vec_Int_t *)0x0) {
                  local_80 = (Vec_Int_t *)malloc(0x100);
                }
                else {
                  local_80 = (Vec_Int_t *)realloc(local_80,0x100);
                }
                pVVar7->pArray = local_80;
                pVVar10 = local_80 + (int)uVar9;
                uVar13 = 0x10;
                uVar9 = 0x10 - uVar9;
              }
              else {
                uVar13 = (ulong)(uVar9 * 2);
                if (local_80 == (Vec_Int_t *)0x0) {
                  local_80 = (Vec_Int_t *)malloc(uVar13 << 4);
                }
                else {
                  local_80 = (Vec_Int_t *)realloc(local_80,uVar13 << 4);
                }
                pVVar7->pArray = local_80;
                pVVar10 = local_80 + local_68;
              }
              memset(pVVar10,0,(ulong)uVar9 << 4);
              pVVar7->nCap = (int)uVar13;
              local_68 = uVar13;
            }
            uVar9 = uVar11 + 1;
            pVVar7->nSize = uVar9;
            if ((int)uVar11 < 0) {
              __assert_fail("p->nSize > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWec.h"
                            ,0x9f,"Vec_Int_t *Vec_WecEntryLast(Vec_Wec_t *)");
            }
            pVVar10 = local_80 + ((ulong)uVar9 - 1);
            iVar5 = iVar4 + uVar1 + 0x14;
            if (pVVar10->nCap < iVar5) {
              if (local_80[(ulong)uVar9 - 1].pArray == (int *)0x0) {
                piVar6 = (int *)malloc((long)iVar5 << 2);
              }
              else {
                piVar6 = (int *)realloc(local_80[(ulong)uVar9 - 1].pArray,(long)iVar5 << 2);
              }
              local_80[(ulong)uVar9 - 1].pArray = piVar6;
              if (piVar6 == (int *)0x0) {
                __assert_fail("p->pArray",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                              ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
              }
              pVVar10->nCap = iVar5;
            }
            Vec_IntPush(pVVar10,(int)lVar8);
            Vec_IntPush(pVVar10,uVar1);
            Vec_IntPush(pVVar10,iVar4);
            if (0 < (int)uVar1) {
              piVar6 = __ptr->pArray;
              uVar13 = 0;
              do {
                Vec_IntPush(pVVar10,piVar6[uVar13]);
                uVar13 = uVar13 + 1;
              } while (uVar1 != uVar13);
            }
            Vec_IntPush(pVVar10,(iVar4 * 1000) / (int)uVar1);
            uVar11 = uVar9;
          }
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < p->nObjs);
  }
  if (vNodes->pArray != (int *)0x0) {
    free(vNodes->pArray);
  }
  free(vNodes);
  if (__ptr->pArray != (int *)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  qsort(local_80,(long)(int)uVar11,0x10,Vec_WecSortCompare6);
  if (0 < (int)uVar11) {
    lVar8 = 0;
    do {
      iVar4 = *(int *)((long)&local_80->nSize + lVar8);
      if (iVar4 < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x396,"int Vec_IntPop(Vec_Int_t *)");
      }
      *(int *)((long)&local_80->nSize + lVar8) = iVar4 + -1;
      lVar8 = lVar8 + 0x10;
    } while ((ulong)uVar11 << 4 != lVar8);
  }
  uVar1 = (int)(RatioBest * uVar11) / 100;
  if ((int)uVar1 < (int)uVar11) {
    ppiVar14 = &local_80[uVar1].pArray;
    uVar9 = uVar1;
    do {
      if ((int)(RatioBest * uVar11) < -99) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWec.h"
                      ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      if (*ppiVar14 != (int *)0x0) {
        free(*ppiVar14);
        *ppiVar14 = (int *)0x0;
      }
      ((Vec_Int_t *)(ppiVar14 + -1))->nCap = 0;
      ((Vec_Int_t *)(ppiVar14 + -1))->nSize = 0;
      ppiVar14 = ppiVar14 + 2;
      uVar9 = uVar9 + 1;
    } while ((int)uVar9 < (int)uVar11);
  }
  if ((int)uVar11 < (int)uVar1) {
    __assert_fail("iPivot <= Vec_WecSize(vMffcs)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaResub.c"
                  ,0x8e,"Vec_Wec_t *Gia_ManComputeMffcs(Gia_Man_t *, int, int, int, int)");
  }
  pVVar7->nSize = uVar1;
  return pVVar7;
}

Assistant:

Vec_Wec_t * Gia_ManComputeMffcs( Gia_Man_t * p, int LimitMin, int LimitMax, int SuppMax, int RatioBest )
{
    Gia_Obj_t * pObj;
    Vec_Wec_t * vMffcs;
    Vec_Int_t * vNodes, * vLeaves, * vInners, * vMffc;
    int i, iPivot;
    assert( p->pMuxes );
    vNodes  = Vec_IntAlloc( 2 * LimitMax );
    vLeaves = Vec_IntAlloc( 2 * LimitMax );
    vInners = Vec_IntAlloc( 2 * LimitMax );
    vMffcs  = Vec_WecAlloc( 1000 );
    Gia_ManCreateRefs( p );
    Gia_ManForEachAnd( p, pObj, i )
    {
        if ( !Gia_ObjRefNum(p, pObj) )
            continue;
        if ( !Gia_ObjCheckMffc(p, pObj, LimitMax, vNodes, vLeaves, vInners) )
            continue;
        if ( Vec_IntSize(vInners) < LimitMin )
            continue;
        if ( Vec_IntSize(vLeaves) > SuppMax )
            continue;
        // improve cut
        // collect cut
        vMffc = Vec_WecPushLevel( vMffcs );
        Vec_IntGrow( vMffc, Vec_IntSize(vLeaves) + Vec_IntSize(vInners) + 20 );
        Vec_IntPush( vMffc, i );
        Vec_IntPush( vMffc, Vec_IntSize(vLeaves) );
        Vec_IntPush( vMffc, Vec_IntSize(vInners) );
        Vec_IntAppend( vMffc, vLeaves );
//        Vec_IntAppend( vMffc, vInners );
        // add last entry equal to the ratio
        Vec_IntPush( vMffc, 1000 * Vec_IntSize(vInners) / Vec_IntSize(vLeaves) );
    }
    Vec_IntFree( vNodes );
    Vec_IntFree( vLeaves );
    Vec_IntFree( vInners );
    // sort MFFCs by their inner/leaf ratio
    Vec_WecSortByLastInt( vMffcs, 1 );
    Vec_WecForEachLevel( vMffcs, vMffc, i )
        Vec_IntPop( vMffc );
    // remove those whose ratio is not good
    iPivot = RatioBest * Vec_WecSize(vMffcs) / 100;
    Vec_WecForEachLevelStart( vMffcs, vMffc, i, iPivot )
        Vec_IntErase( vMffc );
    assert( iPivot <= Vec_WecSize(vMffcs) );
    Vec_WecShrink( vMffcs, iPivot );
    return vMffcs;
}